

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

int keyword(void)

{
  char *cptr;
  int c_00;
  ushort **ppuVar1;
  void *pvVar2;
  bool bVar3;
  keyword *key;
  char *t_cptr;
  int c;
  
  cptr = ::cptr;
  t_cptr._0_4_ = (int)::cptr[1];
  ::cptr = ::cptr + 1;
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[(int)t_cptr] & 0x400) == 0) {
    ::cptr = ::cptr + 1;
    if ((int)t_cptr == 0x7b) {
      return 5;
    }
    if (((int)t_cptr == 0x25) || ((int)t_cptr == 0x5c)) {
      return 4;
    }
    if ((int)t_cptr == 0x3c) {
      return 1;
    }
    if ((int)t_cptr == 0x3e) {
      return 2;
    }
    if ((int)t_cptr == 0x30) {
      return 0;
    }
    if ((int)t_cptr == 0x32) {
      return 3;
    }
    if ((int)t_cptr == 0x40) {
      return 0xb;
    }
    if ((int)t_cptr == 0x24) {
      return 8;
    }
  }
  else {
    cinc = 0;
    while( true ) {
      ppuVar1 = __ctype_b_loc();
      bVar3 = true;
      if (((((*ppuVar1)[(int)t_cptr] & 8) == 0) && (bVar3 = true, (int)t_cptr != 0x5f)) &&
         (bVar3 = true, (int)t_cptr != 0x2e)) {
        bVar3 = (int)t_cptr == 0x24;
      }
      if (!bVar3) break;
      c_00 = tolower((int)t_cptr);
      cachec(c_00);
      t_cptr._0_4_ = (int)::cptr[1];
      ::cptr = ::cptr + 1;
    }
    cachec(0);
    pvVar2 = bsearch(cache,keywords,0xd,0x10,strcmp);
    if (pvVar2 != (void *)0x0) {
      return *(int *)((long)pvVar2 + 0xc);
    }
  }
  syntax_error(input_file->lineno,line,cptr);
  return 0;
}

Assistant:

int keyword()
{
  register int	c;
  char		*t_cptr = cptr;
  struct keyword	*key;

  c = *++cptr;
  if (isalpha(c)) {
    cinc = 0;
    while (isalnum(c) || c == '_' || c == '.' || c == '$') {
      cachec(tolower(c));
      c = *++cptr;
    }
    cachec(NUL);

    if ((key = bsearch(cache, keywords, sizeof(keywords)/sizeof(*key),
		       sizeof(*key),
		       (int (*)(const void *, const void *))strcmp)))
      return key->token;
  } else {
    ++cptr;
    if (c == '{') return (TEXT);
    if (c == '%' || c == '\\') return (MARK);
    if (c == '<') return (LEFT);
    if (c == '>') return (RIGHT);
    if (c == '0') return (TOKEN);
    if (c == '2') return (NONASSOC);
    if (c == '@') return (LOCATION);
    if (c == '$') return (UNION);
  }
  syntax_error(input_file->lineno, line, t_cptr);
  /*NOTREACHED*/
  return 0;
}